

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::setCapacity
          (Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *this,size_t newSize)

{
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar1;
  RemoveConst<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *pRVar2;
  ulong uVar3;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar4;
  __off_t in_RDX;
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> newBuilder;
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> local_38;
  
  uVar3 = ((long)(this->builder).pos - (long)(this->builder).ptr >> 4) * -0x5555555555555555;
  if (newSize <= uVar3 && uVar3 - newSize != 0) {
    ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x30,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pTVar1 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pTVar4 = (this->builder).ptr; pTVar4 != pTVar1; pTVar4 = pTVar4 + 1) {
    ((local_38.pos)->impl).super_TupleElement<0U,_kj::String>.value.content.ptr =
         (pTVar4->impl).super_TupleElement<0U,_kj::String>.value.content.ptr;
    ((local_38.pos)->impl).super_TupleElement<0U,_kj::String>.value.content.size_ =
         (pTVar4->impl).super_TupleElement<0U,_kj::String>.value.content.size_;
    ((local_38.pos)->impl).super_TupleElement<0U,_kj::String>.value.content.disposer =
         (pTVar4->impl).super_TupleElement<0U,_kj::String>.value.content.disposer;
    (pTVar4->impl).super_TupleElement<0U,_kj::String>.value.content.ptr = (char *)0x0;
    (pTVar4->impl).super_TupleElement<0U,_kj::String>.value.content.size_ = 0;
    ((local_38.pos)->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.ptr =
         (pTVar4->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.ptr;
    ((local_38.pos)->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.size_ =
         (pTVar4->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.size_;
    ((local_38.pos)->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.disposer =
         (pTVar4->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.disposer;
    local_38.pos = local_38.pos + 1;
    (pTVar4->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.ptr =
         (unsigned_long *)0x0;
    (pTVar4->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.size_ = 0;
  }
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::operator=
            (&this->builder,&local_38);
  pTVar1 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pTVar4 = local_38.ptr;
  if (local_38.ptr != (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0) {
    local_38.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
    local_38.pos = (RemoveConst<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)0x0;
    local_38.endPtr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pTVar4,0x30,
               ((long)pRVar2 - (long)pTVar4 >> 4) * -0x5555555555555555,
               ((long)pTVar1 - (long)pTVar4 >> 4) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::
               destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }